

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDocumentCopyingContext.cpp
# Opt level: O0

EStatusCode __thiscall
PDFDocumentCopyingContext::Start
          (PDFDocumentCopyingContext *this,IByteReaderWithPosition *inPDFStream,
          DocumentContext *inDocumentContext,ObjectsContext *inObjectsContext,
          PDFParsingOptions *inOptions,IPDFParserExtender *inParserExtender)

{
  EStatusCode EVar1;
  EStatusCode status;
  IPDFParserExtender *inParserExtender_local;
  PDFParsingOptions *inOptions_local;
  ObjectsContext *inObjectsContext_local;
  DocumentContext *inDocumentContext_local;
  IByteReaderWithPosition *inPDFStream_local;
  PDFDocumentCopyingContext *this_local;
  
  this->mDocumentContext = inDocumentContext;
  PDFHummus::DocumentContext::RegisterCopyingContext(inDocumentContext,this);
  PDFDocumentHandler::SetOperationsContexts
            (&this->mDocumentHandler,inDocumentContext,inObjectsContext);
  EVar1 = PDFDocumentHandler::StartStreamCopyingContext
                    (&this->mDocumentHandler,inPDFStream,inOptions);
  if (EVar1 == eSuccess) {
    PDFDocumentHandler::SetParserExtender(&this->mDocumentHandler,inParserExtender);
  }
  return EVar1;
}

Assistant:

EStatusCode PDFDocumentCopyingContext::Start(IByteReaderWithPosition* inPDFStream,
											 DocumentContext* inDocumentContext,
											 ObjectsContext* inObjectsContext,
											const PDFParsingOptions& inOptions,
											 IPDFParserExtender* inParserExtender)
{
	mDocumentContext = inDocumentContext;
	inDocumentContext->RegisterCopyingContext(this);
	mDocumentHandler.SetOperationsContexts(inDocumentContext,inObjectsContext);
	EStatusCode status = mDocumentHandler.StartStreamCopyingContext(inPDFStream, inOptions);
    if(eSuccess == status)
        mDocumentHandler.SetParserExtender(inParserExtender);
    return status;
}